

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_locate_header_sig
                  (mz_zip_archive *pZip,mz_uint32 record_sig,mz_uint32 record_size,mz_int64 *pOfs)

{
  ulong uVar1;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  ulong *in_RDI;
  mz_uint s;
  int n;
  int i;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  mz_int64 cur_file_ofs;
  long local_1058;
  ulong local_1050;
  long local_1048;
  int local_1034;
  int local_1028 [1024];
  long local_28;
  long *local_20;
  uint local_18;
  int local_14;
  ulong *local_10;
  
  if ((ulong)in_EDX <= *in_RDI) {
    if ((long)(*in_RDI - 0x1000) < 1) {
      local_1048 = 0;
    }
    else {
      local_1048 = *in_RDI - 0x1000;
    }
    local_28 = local_1048;
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    while( true ) {
      if (*local_10 - local_28 < 0x1001) {
        local_1050 = *local_10 - local_28;
      }
      else {
        local_1050 = 0x1000;
      }
      uVar1 = (*(code *)local_10[9])(local_10[0xc],local_28,local_1028,(long)(int)local_1050);
      if (uVar1 != (local_1050 & 0xffffffff)) {
        return 0;
      }
      for (local_1034 = (int)local_1050 + -4;
          (-1 < local_1034 &&
          ((*(int *)((long)local_1028 + (long)local_1034) != local_14 ||
           (*local_10 - (local_28 + local_1034) < (ulong)local_18)))); local_1034 = local_1034 + -1)
      {
      }
      if (-1 < local_1034) {
        *local_20 = local_1034 + local_28;
        return 1;
      }
      if ((local_28 == 0) || ((ulong)(local_18 + 0xffff) <= *local_10 - local_28)) break;
      if (local_28 == 0xffd) {
        local_1058 = 0;
      }
      else {
        local_1058 = local_28 + -0xffd;
      }
      local_28 = local_1058;
    }
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_reader_locate_header_sig(mz_zip_archive *pZip,
                                               mz_uint32 record_sig,
                                               mz_uint32 record_size,
                                               mz_int64 *pOfs) {
  mz_int64 cur_file_ofs;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;

  /* Basic sanity checks - reject files which are too small */
  if (pZip->m_archive_size < record_size)
    return MZ_FALSE;

  /* Find the record by scanning the file from the end towards the beginning. */
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);

    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;

    for (i = n - 4; i >= 0; --i) {
      mz_uint s = MZ_READ_LE32(pBuf + i);
      if (s == record_sig) {
        if ((pZip->m_archive_size - (cur_file_ofs + i)) >= record_size)
          break;
      }
    }

    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }

    /* Give up if we've searched the entire file, or we've gone back "too far"
     * (~64kb) */
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (MZ_UINT16_MAX + record_size)))
      return MZ_FALSE;

    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }

  *pOfs = cur_file_ofs;
  return MZ_TRUE;
}